

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

uint32 rw::d3d::calculateTextureSize(uint32 width,uint32 height,uint32 depth,uint32 format)

{
  uint32 format_local;
  uint32 depth_local;
  uint32 height_local;
  uint32 width_local;
  
  if (format == 0) {
    return 0;
  }
  if (format == 0x14) {
    return width * 3 * height * depth;
  }
  if (format - 0x15 < 2) goto LAB_001210bd;
  if (3 < format - 0x17) {
    if (format - 0x1b < 2) goto LAB_0012108a;
    if (1 < format - 0x1d) {
      if (format - 0x1f < 4) goto LAB_001210bd;
      if (format != 0x28) {
        if ((format == 0x29) || (format == 0x32)) {
LAB_0012108a:
          return width * height * depth;
        }
        if (format != 0x33) {
          if (format == 0x34) goto LAB_0012108a;
          if (1 < format - 0x3c) {
            if ((format - 0x3e < 4) || (format == 0x43)) {
LAB_001210bd:
              return width * 4 * height * depth;
            }
            if (format != 0x46) {
              if (format == 0x47) goto LAB_001210bd;
              if (format != 0x49) {
                if (((format == 0x4b) || (format == 0x4d)) || (format == 0x4f)) goto LAB_001210bd;
                if (format != 0x50) {
                  if (format == 0x31545844) {
                    return (width + 3 >> 2) * (height + 3 >> 2) * 8;
                  }
                  if (format == 0x32545844) {
LAB_001210ed:
                    return (width + 3 >> 2) * (height + 3 >> 2) * 0x10;
                  }
                  if (format != 0x32595559) {
                    if (((format == 0x33545844) || (format == 0x34545844)) || (format == 0x35545844)
                       ) goto LAB_001210ed;
                    if (format != 0x59565955) {
                      return 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return width * 2 * height * depth;
}

Assistant:

static uint32
calculateTextureSize(uint32 width, uint32 height, uint32 depth, uint32 format)
{
#define D3DFMT_W11V11U10 65
	switch(format){
	default:
	case D3DFMT_UNKNOWN:
		return 0;
	case D3DFMT_R3G3B2:
	case D3DFMT_A8:
	case D3DFMT_P8:
	case D3DFMT_L8:
	case D3DFMT_A4L4:
		return width * height * depth;
	case D3DFMT_R5G6B5:
	case D3DFMT_X1R5G5B5:
	case D3DFMT_A1R5G5B5:
	case D3DFMT_A4R4G4B4:
	case D3DFMT_A8R3G3B2:
	case D3DFMT_X4R4G4B4:
	case D3DFMT_A8P8:
	case D3DFMT_A8L8:
	case D3DFMT_V8U8:
	case D3DFMT_L6V5U5:
	case D3DFMT_D16_LOCKABLE:
	case D3DFMT_D15S1:
	case D3DFMT_D16:
	case D3DFMT_UYVY:
	case D3DFMT_YUY2:
		return width * 2 * height * depth;
	case D3DFMT_R8G8B8:
		return width * 3 * height * depth;
	case D3DFMT_A8R8G8B8:
	case D3DFMT_X8R8G8B8:
	case D3DFMT_A2B10G10R10:
	case D3DFMT_A8B8G8R8:
	case D3DFMT_X8B8G8R8:
	case D3DFMT_G16R16:
	case D3DFMT_X8L8V8U8:
	case D3DFMT_Q8W8V8U8:
	case D3DFMT_V16U16:
	case D3DFMT_W11V11U10:
	case D3DFMT_A2W10V10U10:
	case D3DFMT_D32:
	case D3DFMT_D24S8:
	case D3DFMT_D24X8:
	case D3DFMT_D24X4S4:
		return width * 4 * height * depth;
	case D3DFMT_DXT1:
		assert(depth <= 1);
		return ((width + 3) >> 2) * ((height + 3) >> 2) * 8;
	case D3DFMT_DXT2:
	case D3DFMT_DXT3:
	case D3DFMT_DXT4:
	case D3DFMT_DXT5:
		assert(depth <= 1);
		return ((width + 3) >> 2) * ((height + 3) >> 2) * 16;
	}
}